

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall
testing::internal::GetBoolAssertionFailureMessage
          (internal *this,AssertionResult *assertion_result,char *expression_text,
          char *actual_predicate_value,char *expected_predicate_value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Message *pMVar2;
  size_t extraout_RDX;
  char *pcVar3;
  String SVar4;
  Message msg;
  char *actual_message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  pbVar1 = (assertion_result->message_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = (pbVar1->_M_dataplus)._M_p;
  }
  local_38 = pcVar3;
  local_30 = expected_predicate_value;
  local_28 = actual_predicate_value;
  local_20 = expression_text;
  Message::Message((Message *)&local_40);
  pMVar2 = Message::operator<<((Message *)&local_40,(char (*) [11])"Value of: ");
  pMVar2 = Message::operator<<(pMVar2,&local_20);
  pMVar2 = Message::operator<<(pMVar2,(char (*) [12])"\n  Actual: ");
  Message::operator<<(pMVar2,&local_28);
  if (*pcVar3 != '\0') {
    pMVar2 = Message::operator<<((Message *)&local_40,(char (*) [3])0x137658);
    pMVar2 = Message::operator<<(pMVar2,&local_38);
    Message::operator<<(pMVar2,(char (*) [2])0x137b85);
  }
  pMVar2 = Message::operator<<((Message *)&local_40,(char (*) [12])"\nExpected: ");
  Message::operator<<(pMVar2,&local_30);
  StringStreamToString(this,local_40.ptr_);
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String GetBoolAssertionFailureMessage(const AssertionResult& assertion_result,
                                      const char* expression_text,
                                      const char* actual_predicate_value,
                                      const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}